

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Saig_ManBmcTerSimCount01(Aig_Man_t *p,uint *pInfo)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = p->nRegs;
  uVar4 = (ulong)uVar3;
  if (pInfo != (uint *)0x0) {
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    else {
      uVar5 = (ulong)(uint)p->nTruePos;
      uVar3 = 0;
      do {
        if ((p->nTruePos < 0) || (p->vCos->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = p->vCos->pArray[uVar5];
        if ((*(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) & 7) != 1) {
          iVar1 = *(int *)((long)pvVar2 + 0x24);
          uVar3 = (uVar3 + 1) -
                  (uint)((~(pInfo[iVar1 >> 4] >> ((char)iVar1 * '\x02' & 0x1fU)) & 3) == 0);
        }
        uVar5 = uVar5 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return uVar3;
}

Assistant:

int Saig_ManBmcTerSimCount01( Aig_Man_t * p, unsigned * pInfo )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    if ( pInfo == NULL )
        return Saig_ManRegNum(p);
    Saig_ManForEachLi( p, pObj, i )
        if ( !Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            Counter += (Saig_ManBmcSimInfoGet(pInfo, pObj) != SAIG_TER_UND);
    return Counter;
}